

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImageAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::PreviewImage>::writeValueTo
          (TypedAttribute<Imf_2_5::PreviewImage> *this,OStream *os,int version)

{
  uint uVar1;
  uint uVar2;
  OStream *in_RSI;
  long in_RDI;
  int i;
  PreviewRgba *pixels;
  int numPixels;
  uint in_stack_ffffffffffffffbc;
  undefined4 local_24;
  
  PreviewImage::width((PreviewImage *)(in_RDI + 8));
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffffbc);
  PreviewImage::height((PreviewImage *)(in_RDI + 8));
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RSI,in_stack_ffffffffffffffbc);
  uVar1 = PreviewImage::width((PreviewImage *)(in_RDI + 8));
  uVar2 = PreviewImage::height((PreviewImage *)(in_RDI + 8));
  PreviewImage::pixels((PreviewImage *)(in_RDI + 8));
  for (local_24 = 0; local_24 < (int)(uVar1 * uVar2); local_24 = local_24 + 1) {
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_RSI,(uchar)(in_stack_ffffffffffffffbc >> 0x18));
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_RSI,(uchar)(in_stack_ffffffffffffffbc >> 0x18));
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_RSI,(uchar)(in_stack_ffffffffffffffbc >> 0x18));
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_RSI,(uchar)(in_stack_ffffffffffffffbc >> 0x18));
  }
  return;
}

Assistant:

void
PreviewImageAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.width());
    Xdr::write <StreamIO> (os, _value.height());

    int numPixels = _value.width() * _value.height();
    const PreviewRgba *pixels = _value.pixels();

    for (int i = 0; i < numPixels; ++i)
    {
	Xdr::write <StreamIO> (os, pixels[i].r);
	Xdr::write <StreamIO> (os, pixels[i].g);
	Xdr::write <StreamIO> (os, pixels[i].b);
	Xdr::write <StreamIO> (os, pixels[i].a);
    }
}